

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

xmlXPathObjectPtr xmlXPathCacheWrapString(xmlXPathContextPtr ctxt,xmlChar *val)

{
  int iVar1;
  void *pvVar2;
  long *plVar3;
  xmlXPathObjectPtr pxVar4;
  
  if ((ctxt != (xmlXPathContextPtr)0x0) && (pvVar2 = ctxt->cache, pvVar2 != (void *)0x0)) {
    plVar3 = *(long **)((long)pvVar2 + 8);
    if (plVar3 != (long *)0x0) {
      iVar1 = (int)plVar3[1];
      if ((long)iVar1 != 0) {
        *(int *)(plVar3 + 1) = iVar1 + -1;
        pxVar4 = *(xmlXPathObjectPtr *)(*plVar3 + -8 + (long)iVar1 * 8);
        goto LAB_001d80b9;
      }
    }
    plVar3 = *(long **)((long)pvVar2 + 0x20);
    if (plVar3 != (long *)0x0) {
      iVar1 = (int)plVar3[1];
      if ((long)iVar1 != 0) {
        *(int *)(plVar3 + 1) = iVar1 + -1;
        pxVar4 = *(xmlXPathObjectPtr *)(*plVar3 + -8 + (long)iVar1 * 8);
LAB_001d80b9:
        pxVar4->type = XPATH_STRING;
        pxVar4->stringval = val;
        return pxVar4;
      }
    }
  }
  pxVar4 = xmlXPathWrapString(val);
  return pxVar4;
}

Assistant:

static xmlXPathObjectPtr
xmlXPathCacheWrapString(xmlXPathContextPtr ctxt, xmlChar *val)
{
    if ((ctxt != NULL) && (ctxt->cache != NULL)) {
	xmlXPathContextCachePtr cache = (xmlXPathContextCachePtr) ctxt->cache;

	if ((cache->stringObjs != NULL) &&
	    (cache->stringObjs->number != 0))
	{

	    xmlXPathObjectPtr ret;

	    ret = (xmlXPathObjectPtr)
		cache->stringObjs->items[--cache->stringObjs->number];
	    ret->type = XPATH_STRING;
	    ret->stringval = val;
#ifdef XP_DEBUG_OBJ_USAGE
	    xmlXPathDebugObjUsageRequested(ctxt, XPATH_STRING);
#endif
	    return(ret);
	} else if ((cache->miscObjs != NULL) &&
	    (cache->miscObjs->number != 0))
	{
	    xmlXPathObjectPtr ret;
	    /*
	    * Fallback to misc-cache.
	    */
	    ret = (xmlXPathObjectPtr)
		cache->miscObjs->items[--cache->miscObjs->number];

	    ret->type = XPATH_STRING;
	    ret->stringval = val;
#ifdef XP_DEBUG_OBJ_USAGE
	    xmlXPathDebugObjUsageRequested(ctxt, XPATH_STRING);
#endif
	    return(ret);
	}
    }
    return(xmlXPathWrapString(val));
}